

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder_init_vfs_w
                    (ma_vfs *pVFS,wchar_t *pFilePath,ma_decoder_config *pConfig,ma_decoder *pDecoder
                    )

{
  ma_result mVar1;
  ma_bool32 mVar2;
  ma_decoder_config *pConfig_00;
  ma_decoder *pDecoder_00;
  ma_decoder_config config;
  ma_decoder_config config_1;
  
  pDecoder_00 = (ma_decoder *)&config;
  if (pConfig == (ma_decoder_config *)0x0) {
    memset(&config_1,0,0x90);
  }
  else {
    memcpy(&config_1,pConfig,0x90);
  }
  memcpy(&config,&config_1,0x90);
  mVar1 = ma_decoder__preinit(ma_decoder__on_read_vfs,ma_decoder__on_seek_vfs,
                              ma_decoder__on_tell_vfs,(void *)0x0,&config,pDecoder);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  if (pFilePath == (wchar_t *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (*pFilePath == L'\0') {
    return MA_INVALID_ARGS;
  }
  mVar1 = ma_vfs_or_default_open_w(pVFS,pFilePath,1,(ma_vfs_file *)&config_1);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  (pDecoder->data).vfs.pVFS = pVFS;
  (pDecoder->data).vfs.file = (ma_vfs_file)config_1._0_8_;
  pConfig_00 = (ma_decoder_config *)(ulong)config.encodingFormat;
  if (config.encodingFormat == ma_encoding_format_unknown) {
LAB_001500f5:
    mVar1 = ma_decoder_init_custom__internal(&config,pDecoder);
    if (mVar1 != MA_SUCCESS) {
      ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      if (config.encodingFormat != ma_encoding_format_unknown) {
        return MA_NO_BACKEND;
      }
      mVar2 = ma_path_extension_equal_w(pFilePath,L"wav");
      if (mVar2 != 0) {
        mVar1 = ma_decoder_init_wav__internal(&config,pDecoder);
        if (mVar1 == MA_SUCCESS) goto LAB_001501d6;
        ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      }
      mVar2 = ma_path_extension_equal_w(pFilePath,L"flac");
      if (mVar2 != 0) {
        mVar1 = ma_decoder_init_flac__internal(&config,pDecoder);
        if (mVar1 == MA_SUCCESS) goto LAB_001501d6;
        ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      }
      mVar2 = ma_path_extension_equal_w(pFilePath,L"mp3");
      if (mVar2 != 0) {
        mVar1 = ma_decoder_init_mp3__internal(&config,pDecoder);
        if (mVar1 == MA_SUCCESS) goto LAB_001501d6;
        ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      }
      mVar1 = ma_decoder_init__internal
                        (ma_decoder__on_seek_vfs,(ma_decoder_seek_proc)&config,pDecoder,pConfig_00,
                         pDecoder_00);
      goto LAB_001501e1;
    }
    if (config.encodingFormat != ma_encoding_format_unknown) {
      return MA_NO_BACKEND;
    }
  }
  else {
    mVar1 = MA_NO_BACKEND;
    if (config.encodingFormat == ma_encoding_format_wav) {
      mVar1 = ma_decoder_init_wav__internal(&config,pDecoder);
      pConfig_00 = (ma_decoder_config *)(ulong)config.encodingFormat;
    }
    if ((int)pConfig_00 == 2) {
      mVar1 = ma_decoder_init_flac__internal(&config,pDecoder);
      pConfig_00 = (ma_decoder_config *)(ulong)config.encodingFormat;
    }
    if ((int)pConfig_00 == 3) {
      mVar1 = ma_decoder_init_mp3__internal(&config,pDecoder);
      pConfig_00 = (ma_decoder_config *)(ulong)config.encodingFormat;
    }
    if ((int)pConfig_00 == 4) {
      mVar1 = ma_decoder_init_vorbis__internal(&config,pDecoder);
    }
    if (mVar1 != MA_SUCCESS) {
      ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      goto LAB_001500f5;
    }
  }
LAB_001501d6:
  mVar1 = ma_decoder__postinit(&config,pDecoder);
LAB_001501e1:
  if (mVar1 == MA_SUCCESS) {
    mVar1 = MA_SUCCESS;
  }
  else {
    ma_vfs_or_default_close(pVFS,(pDecoder->data).vfs.file);
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_init_vfs_w(ma_vfs* pVFS, const wchar_t* pFilePath, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);
    result = ma_decoder__preinit_vfs_w(pVFS, pFilePath, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis__internal(&config, pDecoder);
        }
    #endif

        /* Make sure we seek back to the start if we didn't initialize a decoder successfully so the next attempts have a fresh start. */
        if (result != MA_SUCCESS) {
            ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
        }
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_custom__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS && ma_path_extension_equal_w(pFilePath, L"wav")) {
            result = ma_decoder_init_wav__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS && ma_path_extension_equal_w(pFilePath, L"flac")) {
            result = ma_decoder_init_flac__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS && ma_path_extension_equal_w(pFilePath, L"mp3")) {
            result = ma_decoder_init_mp3__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    }

    /* If we still haven't got a result just use trial and error. Otherwise we can finish up. */
    if (result != MA_SUCCESS) {
        result = ma_decoder_init__internal(ma_decoder__on_read_vfs, ma_decoder__on_seek_vfs, NULL, &config, pDecoder);
    } else {
        result = ma_decoder__postinit(&config, pDecoder);
    }

    if (result != MA_SUCCESS) {
        ma_vfs_or_default_close(pVFS, pDecoder->data.vfs.file);
        return result;
    }

    return MA_SUCCESS;
}